

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_t *psVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_type sVar4;
  undefined8 *puVar5;
  ConstantValue *pCVar6;
  Type *pTVar7;
  Symbol *pSVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pSVar12;
  pointer pSVar13;
  pointer pSVar14;
  long lVar15;
  ulong capacity;
  long lVar16;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar3 = this->cap;
  if (capacity < uVar3 * 2) {
    capacity = uVar3 * 2;
  }
  if (0x7fffffffffffffff - uVar3 < uVar3) {
    capacity = 0x7fffffffffffffff;
  }
  lVar16 = (long)pos - (long)this->data_;
  pSVar13 = (pointer)detail::allocArray(capacity,0x28);
  *(Symbol **)((long)pSVar13 + lVar16 + 0x20) = (args->fieldEnd).current;
  pCVar6 = args->val;
  pTVar7 = args->type;
  pSVar8 = (args->fieldIt).current;
  psVar1 = (size_t *)((long)pSVar13 + lVar16 + 0x10);
  *psVar1 = args->valIndex;
  psVar1[1] = (size_t)pSVar8;
  *(undefined8 *)((long)pSVar13 + lVar16) = pCVar6;
  ((undefined8 *)((long)pSVar13 + lVar16))[1] = pTVar7;
  pSVar14 = this->data_;
  sVar4 = this->len;
  pSVar12 = pSVar13;
  if (pSVar14 + sVar4 == pos) {
    if (sVar4 != 0) {
      lVar15 = 0;
      do {
        *(undefined8 *)((long)&(pSVar13->fieldEnd).current + lVar15) =
             *(undefined8 *)((long)&(pSVar14->fieldEnd).current + lVar15);
        puVar5 = (undefined8 *)((long)&pSVar14->val + lVar15);
        uVar9 = *puVar5;
        uVar10 = puVar5[1];
        puVar5 = (undefined8 *)((long)&pSVar14->valIndex + lVar15);
        uVar11 = puVar5[1];
        puVar2 = (undefined8 *)((long)&pSVar13->valIndex + lVar15);
        *puVar2 = *puVar5;
        puVar2[1] = uVar11;
        puVar5 = (undefined8 *)((long)&pSVar13->val + lVar15);
        *puVar5 = uVar9;
        puVar5[1] = uVar10;
        lVar15 = lVar15 + 0x28;
      } while (sVar4 * 0x28 != lVar15);
    }
  }
  else {
    for (; pSVar14 != pos; pSVar14 = pSVar14 + 1) {
      (pSVar12->fieldEnd).current = (pSVar14->fieldEnd).current;
      pCVar6 = pSVar14->val;
      pTVar7 = pSVar14->type;
      pSVar8 = (pSVar14->fieldIt).current;
      pSVar12->valIndex = pSVar14->valIndex;
      (pSVar12->fieldIt).current = pSVar8;
      pSVar12->val = pCVar6;
      pSVar12->type = pTVar7;
      pSVar12 = pSVar12 + 1;
    }
    sVar4 = this->len;
    pSVar14 = this->data_;
    if (pSVar14 + sVar4 != pos) {
      puVar5 = (undefined8 *)(lVar16 + (long)pSVar13);
      do {
        puVar5[9] = (pos->fieldEnd).current;
        pCVar6 = pos->val;
        pTVar7 = pos->type;
        pSVar8 = (pos->fieldIt).current;
        puVar5[7] = pos->valIndex;
        puVar5[8] = pSVar8;
        puVar5[5] = pCVar6;
        puVar5[6] = pTVar7;
        pos = pos + 1;
        puVar5 = puVar5 + 5;
      } while (pos != pSVar14 + sVar4);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar13;
  return (pointer)((long)pSVar13 + lVar16);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}